

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printbuf.c
# Opt level: O1

int sprintbuf(printbuf *p,char *msg,...)

{
  char in_AL;
  uint size;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *t;
  va_list ap;
  char buf [128];
  char *local_180;
  undefined8 local_178;
  char **local_170;
  undefined1 *local_168;
  char local_158 [128];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_178 = 0x3000000010;
  local_170 = &t;
  local_168 = local_d8;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  size = vsnprintf(local_158,0x80,msg,&local_178);
  if (size < 0x80) {
    iVar1 = printbuf_memappend(p,local_158,size);
  }
  else {
    local_178 = 0x3000000010;
    local_170 = &t;
    local_168 = local_d8;
    iVar1 = vasprintf(&local_180,msg,&local_178);
    if (iVar1 < 0) {
      iVar1 = -1;
    }
    else {
      iVar1 = printbuf_memappend(p,local_180,iVar1);
      free(local_180);
    }
  }
  return iVar1;
}

Assistant:

int sprintbuf(struct printbuf *p, const char *msg, ...)
{
	va_list ap;
	char *t;
	int size;
	char buf[128];

	/* use stack buffer first */
	va_start(ap, msg);
	size = vsnprintf(buf, 128, msg, ap);
	va_end(ap);
	/* if string is greater than stack buffer, then use dynamic string
	 * with vasprintf.  Note: some implementations of vsnprintf return -1
	 * if output is truncated whereas some return the number of bytes that
	 * would have been written - this code handles both cases.
	 */
	if (size < 0 || size > 127)
	{
		va_start(ap, msg);
		if ((size = vasprintf(&t, msg, ap)) < 0)
		{
			va_end(ap);
			return -1;
		}
		va_end(ap);
		size = printbuf_memappend(p, t, size);
		free(t);
	}
	else
	{
		size = printbuf_memappend(p, buf, size);
	}
	return size;
}